

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

uint32_t mp_sizeof_uint(uint64_t num)

{
  uint32_t uVar1;
  
  uVar1 = 1;
  if (((0x7f < num) && (uVar1 = 2, 0xff < num)) && (uVar1 = 3, 0xffff < num)) {
    uVar1 = (uint)(num >> 0x20 != 0) * 4 + 5;
  }
  return uVar1;
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_uint(uint64_t num)
{
	if (num <= 0x7f) {
		return 1;
	} else if (num <= UINT8_MAX) {
		return 1 + sizeof(uint8_t);
	} else if (num <= UINT16_MAX) {
		return 1 + sizeof(uint16_t);
	} else if (num <= UINT32_MAX) {
		return 1 + sizeof(uint32_t);
	} else {
		return 1 + sizeof(uint64_t);
	}
}